

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

Class * __thiscall cppgenerate::Class::setIsQObject(Class *this,bool isQObject)

{
  undefined7 in_register_00000031;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((int)CONCAT71(in_register_00000031,isQObject) != 0) {
    std::__cxx11::string::string((string *)&local_30,"QObject",&local_72);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->m_systemIncludes,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::string((string *)&local_50,"QObject",&local_72);
    std::__cxx11::string::string((string *)&local_70,"",&local_71);
    addParentClass(this,&local_50,PUBLIC,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  this->m_isQobject = isQObject;
  return this;
}

Assistant:

Class& Class::setIsQObject( const bool isQObject ){
    if( isQObject ){
        addSystemInclude( "QObject" );
        addParentClass( "QObject", cppgenerate::AccessModifier::PUBLIC );
    }

    m_isQobject = isQObject;

    return *this;
}